

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model.cpp
# Opt level: O0

char * llm_type_name(llm_type type)

{
  llm_type type_local;
  char *local_8;
  
  switch(type) {
  case LLM_TYPE_14M:
    local_8 = "14M";
    break;
  case LLM_TYPE_17M:
    local_8 = "17M";
    break;
  case LLM_TYPE_22M:
    local_8 = "22M";
    break;
  case LLM_TYPE_33M:
    local_8 = "33M";
    break;
  case LLM_TYPE_60M:
    local_8 = "60M";
    break;
  case LLM_TYPE_70M:
    local_8 = "70M";
    break;
  case LLM_TYPE_80M:
    local_8 = "80M";
    break;
  case LLM_TYPE_109M:
    local_8 = "109M";
    break;
  case LLM_TYPE_137M:
    local_8 = "137M";
    break;
  case LLM_TYPE_160M:
    local_8 = "160M";
    break;
  case LLM_TYPE_190M:
    local_8 = "190M";
    break;
  case LLM_TYPE_220M:
    local_8 = "220M";
    break;
  case LLM_TYPE_250M:
    local_8 = "250M";
    break;
  case LLM_TYPE_270M:
    local_8 = "270M";
    break;
  case LLM_TYPE_335M:
    local_8 = "335M";
    break;
  case LLM_TYPE_410M:
    local_8 = "410M";
    break;
  case LLM_TYPE_450M:
    local_8 = "450M";
    break;
  case LLM_TYPE_770M:
    local_8 = "770M";
    break;
  case LLM_TYPE_780M:
    local_8 = "780M";
    break;
  case LLM_TYPE_0_5B:
    local_8 = "0.5B";
    break;
  case LLM_TYPE_1B:
    local_8 = "1B";
    break;
  case LLM_TYPE_1_3B:
    local_8 = "1.3B";
    break;
  case LLM_TYPE_1_4B:
    local_8 = "1.4B";
    break;
  case LLM_TYPE_1_5B:
    local_8 = "1.5B";
    break;
  case LLM_TYPE_1_6B:
    local_8 = "1.6B";
    break;
  case LLM_TYPE_1_8B:
    local_8 = "1.8B";
    break;
  case LLM_TYPE_2B:
    local_8 = "2B";
    break;
  case LLM_TYPE_2_8B:
    local_8 = "2.8B";
    break;
  case LLM_TYPE_2_9B:
    local_8 = "2.9B";
    break;
  case LLM_TYPE_3B:
    local_8 = "3B";
    break;
  case LLM_TYPE_4B:
    local_8 = "4B";
    break;
  case LLM_TYPE_6B:
    local_8 = "6B";
    break;
  case LLM_TYPE_6_9B:
    local_8 = "6.9B";
    break;
  case LLM_TYPE_7B:
    local_8 = "7B";
    break;
  case LLM_TYPE_8B:
    local_8 = "8B";
    break;
  case LLM_TYPE_9B:
    local_8 = "9B";
    break;
  case LLM_TYPE_11B:
    local_8 = "11B";
    break;
  case LLM_TYPE_12B:
    local_8 = "12B";
    break;
  case LLM_TYPE_13B:
    local_8 = "13B";
    break;
  case LLM_TYPE_14B:
    local_8 = "14B";
    break;
  case LLM_TYPE_15B:
    local_8 = "15B";
    break;
  case LLM_TYPE_16B:
    local_8 = "16B";
    break;
  case LLM_TYPE_20B:
    local_8 = "20B";
    break;
  case LLM_TYPE_30B:
    local_8 = "30B";
    break;
  case LLM_TYPE_32B:
    local_8 = "32B";
    break;
  case LLM_TYPE_34B:
    local_8 = "34B";
    break;
  case LLM_TYPE_35B:
    local_8 = "35B";
    break;
  case LLM_TYPE_40B:
    local_8 = "40B";
    break;
  case LLM_TYPE_65B:
    local_8 = "65B";
    break;
  case LLM_TYPE_70B:
    local_8 = "70B";
    break;
  case LLM_TYPE_236B:
    local_8 = "236B";
    break;
  case LLM_TYPE_314B:
    local_8 = "314B";
    break;
  case LLM_TYPE_671B:
    local_8 = "671B";
    break;
  case LLM_TYPE_SMALL:
    local_8 = "0.1B";
    break;
  case LLM_TYPE_MEDIUM:
    local_8 = "0.4B";
    break;
  case LLM_TYPE_LARGE:
    local_8 = "0.8B";
    break;
  case LLM_TYPE_XL:
    local_8 = "1.5B";
    break;
  case LLM_TYPE_A1_7B:
    local_8 = "A1.7B";
    break;
  case LLM_TYPE_A2_7B:
    local_8 = "A2.7B";
    break;
  case LLM_TYPE_8x7B:
    local_8 = "8x7B";
    break;
  case LLM_TYPE_8x22B:
    local_8 = "8x22B";
    break;
  case LLM_TYPE_16x12B:
    local_8 = "16x12B";
    break;
  case LLM_TYPE_16x3_8B:
    local_8 = "16x3.8B";
    break;
  case LLM_TYPE_10B_128x3_66B:
    local_8 = "10B+128x3.66B";
    break;
  case LLM_TYPE_57B_A14B:
    local_8 = "57B.A14B";
    break;
  case LLM_TYPE_27B:
    local_8 = "27B";
    break;
  case LLM_TYPE_290B:
    local_8 = "290B";
    break;
  case LLM_TYPE_17B_16E:
    local_8 = "17Bx16E (Scout)";
    break;
  case LLM_TYPE_17B_128E:
    local_8 = "17Bx128E (Maverick)";
    break;
  default:
    local_8 = "?B";
  }
  return local_8;
}

Assistant:

const char * llm_type_name(llm_type type) {
    switch (type) {
        case LLM_TYPE_14M:           return "14M";
        case LLM_TYPE_17M:           return "17M";
        case LLM_TYPE_22M:           return "22M";
        case LLM_TYPE_33M:           return "33M";
        case LLM_TYPE_60M:           return "60M";
        case LLM_TYPE_70M:           return "70M";
        case LLM_TYPE_80M:           return "80M";
        case LLM_TYPE_109M:          return "109M";
        case LLM_TYPE_137M:          return "137M";
        case LLM_TYPE_160M:          return "160M";
        case LLM_TYPE_190M:          return "190M";
        case LLM_TYPE_220M:          return "220M";
        case LLM_TYPE_250M:          return "250M";
        case LLM_TYPE_270M:          return "270M";
        case LLM_TYPE_335M:          return "335M";
        case LLM_TYPE_410M:          return "410M";
        case LLM_TYPE_450M:          return "450M";
        case LLM_TYPE_770M:          return "770M";
        case LLM_TYPE_780M:          return "780M";
        case LLM_TYPE_0_5B:          return "0.5B";
        case LLM_TYPE_1B:            return "1B";
        case LLM_TYPE_1_3B:          return "1.3B";
        case LLM_TYPE_1_4B:          return "1.4B";
        case LLM_TYPE_1_5B:          return "1.5B";
        case LLM_TYPE_1_6B:          return "1.6B";
        case LLM_TYPE_1_8B:          return "1.8B";
        case LLM_TYPE_2B:            return "2B";
        case LLM_TYPE_2_8B:          return "2.8B";
        case LLM_TYPE_2_9B:          return "2.9B";
        case LLM_TYPE_3B:            return "3B";
        case LLM_TYPE_4B:            return "4B";
        case LLM_TYPE_6B:            return "6B";
        case LLM_TYPE_6_9B:          return "6.9B";
        case LLM_TYPE_7B:            return "7B";
        case LLM_TYPE_8B:            return "8B";
        case LLM_TYPE_9B:            return "9B";
        case LLM_TYPE_11B:           return "11B";
        case LLM_TYPE_12B:           return "12B";
        case LLM_TYPE_13B:           return "13B";
        case LLM_TYPE_14B:           return "14B";
        case LLM_TYPE_15B:           return "15B";
        case LLM_TYPE_16B:           return "16B";
        case LLM_TYPE_20B:           return "20B";
        case LLM_TYPE_30B:           return "30B";
        case LLM_TYPE_32B:           return "32B";
        case LLM_TYPE_34B:           return "34B";
        case LLM_TYPE_35B:           return "35B";
        case LLM_TYPE_40B:           return "40B";
        case LLM_TYPE_65B:           return "65B";
        case LLM_TYPE_70B:           return "70B";
        case LLM_TYPE_236B:          return "236B";
        case LLM_TYPE_314B:          return "314B";
        case LLM_TYPE_671B:          return "671B";
        case LLM_TYPE_SMALL:         return "0.1B";
        case LLM_TYPE_MEDIUM:        return "0.4B";
        case LLM_TYPE_LARGE:         return "0.8B";
        case LLM_TYPE_XL:            return "1.5B";
        case LLM_TYPE_A1_7B:         return "A1.7B";
        case LLM_TYPE_A2_7B:         return "A2.7B";
        case LLM_TYPE_8x7B:          return "8x7B";
        case LLM_TYPE_8x22B:         return "8x22B";
        case LLM_TYPE_16x12B:        return "16x12B";
        case LLM_TYPE_16x3_8B:       return "16x3.8B";
        case LLM_TYPE_10B_128x3_66B: return "10B+128x3.66B";
        case LLM_TYPE_57B_A14B:      return "57B.A14B";
        case LLM_TYPE_27B:           return "27B";
        case LLM_TYPE_290B:          return "290B";
        case LLM_TYPE_17B_16E:       return "17Bx16E (Scout)";
        case LLM_TYPE_17B_128E:      return "17Bx128E (Maverick)";
        default:                     return "?B";
    }
}